

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckNode(RtreeCheck *pCheck,int iDepth,u8 *aParent,i64 iNode)

{
  uint uVar1;
  u8 *p;
  i64 iKey;
  i64 iVal;
  u8 *pCell;
  int i;
  int nCell;
  int nNode;
  u8 *aNode;
  i64 iNode_local;
  u8 *aParent_local;
  RtreeCheck *pRStack_10;
  int iDepth_local;
  RtreeCheck *pCheck_local;
  
  _nCell = (u8 *)0x0;
  i = 0;
  aNode = (u8 *)iNode;
  iNode_local = (i64)aParent;
  aParent_local._4_4_ = iDepth;
  pRStack_10 = pCheck;
  _nCell = rtreeCheckGetNode(pCheck,iNode,&i);
  if (_nCell != (u8 *)0x0) {
    if (i < 4) {
      rtreeCheckAppendMsg(pRStack_10,"Node %lld is too small (%d bytes)",aNode,(ulong)(uint)i);
    }
    else {
      if ((iNode_local == 0) &&
         (aParent_local._4_4_ = readInt16(_nCell), 0x28 < (int)aParent_local._4_4_)) {
        rtreeCheckAppendMsg(pRStack_10,"Rtree depth out of range (%d)",(ulong)aParent_local._4_4_);
        sqlite3_free(_nCell);
        return;
      }
      uVar1 = readInt16(_nCell + 2);
      if (i < (int)(uVar1 * (pRStack_10->nDim * 8 + 8) + 4)) {
        rtreeCheckAppendMsg(pRStack_10,"Node %lld is too small for cell count of %d (%d bytes)",
                            aNode,(ulong)uVar1,(ulong)(uint)i);
      }
      else {
        for (pCell._4_4_ = 0; pCell._4_4_ < (int)uVar1; pCell._4_4_ = pCell._4_4_ + 1) {
          p = _nCell + (pCell._4_4_ * (pRStack_10->nDim * 8 + 8) + 4);
          iKey = readInt64(p);
          rtreeCheckCellCoord(pRStack_10,(i64)aNode,pCell._4_4_,p + 8,(u8 *)iNode_local);
          if ((int)aParent_local._4_4_ < 1) {
            rtreeCheckMapping(pRStack_10,1,iKey,(i64)aNode);
            pRStack_10->nLeaf = pRStack_10->nLeaf + 1;
          }
          else {
            rtreeCheckMapping(pRStack_10,0,iKey,(i64)aNode);
            rtreeCheckNode(pRStack_10,aParent_local._4_4_ - 1,p + 8,iKey);
            pRStack_10->nNonLeaf = pRStack_10->nNonLeaf + 1;
          }
        }
      }
    }
    sqlite3_free(_nCell);
  }
  return;
}

Assistant:

static void rtreeCheckNode(
  RtreeCheck *pCheck,
  int iDepth,                     /* Depth of iNode (0==leaf) */
  u8 *aParent,                    /* Buffer containing parent coords */
  i64 iNode                       /* Node to check */
){
  u8 *aNode = 0;
  int nNode = 0;

  assert( iNode==1 || aParent!=0 );
  assert( pCheck->nDim>0 );

  aNode = rtreeCheckGetNode(pCheck, iNode, &nNode);
  if( aNode ){
    if( nNode<4 ){
      rtreeCheckAppendMsg(pCheck, 
          "Node %lld is too small (%d bytes)", iNode, nNode
      );
    }else{
      int nCell;                  /* Number of cells on page */
      int i;                      /* Used to iterate through cells */
      if( aParent==0 ){
        iDepth = readInt16(aNode);
        if( iDepth>RTREE_MAX_DEPTH ){
          rtreeCheckAppendMsg(pCheck, "Rtree depth out of range (%d)", iDepth);
          sqlite3_free(aNode);
          return;
        }
      }
      nCell = readInt16(&aNode[2]);
      if( (4 + nCell*(8 + pCheck->nDim*2*4))>nNode ){
        rtreeCheckAppendMsg(pCheck, 
            "Node %lld is too small for cell count of %d (%d bytes)", 
            iNode, nCell, nNode
        );
      }else{
        for(i=0; i<nCell; i++){
          u8 *pCell = &aNode[4 + i*(8 + pCheck->nDim*2*4)];
          i64 iVal = readInt64(pCell);
          rtreeCheckCellCoord(pCheck, iNode, i, &pCell[8], aParent);

          if( iDepth>0 ){
            rtreeCheckMapping(pCheck, 0, iVal, iNode);
            rtreeCheckNode(pCheck, iDepth-1, &pCell[8], iVal);
            pCheck->nNonLeaf++;
          }else{
            rtreeCheckMapping(pCheck, 1, iVal, iNode);
            pCheck->nLeaf++;
          }
        }
      }
    }
    sqlite3_free(aNode);
  }
}